

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int flatcc_builder_truncate_string(flatcc_builder_t *B,size_t len)

{
  size_t len_local;
  flatcc_builder_t *B_local;
  
  if (B->frame->type != 6) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_string",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x400,"int flatcc_builder_truncate_string(flatcc_builder_t *, size_t)");
  }
  if ((B->frame->container).table.pl_end < len) {
    if ((B->frame->container).table.pl_end < len) {
      __assert_fail("(B->frame[0].container.vector.count) >= len",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x401,"int flatcc_builder_truncate_string(flatcc_builder_t *, size_t)");
    }
    B_local._4_4_ = -1;
  }
  else {
    (B->frame->container).table.pl_end =
         (B->frame->container).table.pl_end - (flatbuffers_uoffset_t)len;
    unpush_ds(B,(flatbuffers_uoffset_t)len);
    B_local._4_4_ = 0;
  }
  return B_local._4_4_;
}

Assistant:

int flatcc_builder_truncate_string(flatcc_builder_t *B, size_t len)
{
    check(frame(type) == flatcc_builder_string, "expected string frame");
    check_error(frame(container.vector.count) >= len, -1, "cannot truncate string past empty");
    frame(container.vector.count) -= (uoffset_t)len;
    unpush_ds(B, (uoffset_t)len);
    return 0;
}